

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_perf_strided.c
# Opt level: O2

void grid_factor(int p,int *idx,int *idy)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  int fac [256];
  int prime [256];
  
  dVar9 = (double)p;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  iVar8 = 2;
  uVar5 = 0;
  do {
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = (ulong)uVar5;
    }
    if ((int)dVar9 + 1 < iVar8) {
      iVar6 = 0;
      iVar8 = p;
      for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
        iVar1 = prime[uVar4];
        piVar3 = fac + iVar6;
        while (iVar8 % iVar1 == 0) {
          *piVar3 = iVar1;
          iVar6 = iVar6 + 1;
          piVar3 = piVar3 + 1;
          iVar8 = iVar8 / iVar1;
        }
      }
      if (iVar6 == 0) {
        fac[0] = p;
      }
      *idx = 1;
      *idy = 1;
      for (uVar7 = (ulong)(iVar6 + (uint)(iVar6 == 0)); 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        iVar8 = *idx;
        iVar6 = *idy;
        iVar1 = iVar6;
        if (iVar8 < iVar6) {
          iVar1 = iVar8;
        }
        piVar3 = idx;
        if (iVar6 < iVar8) {
          piVar3 = idy;
        }
        *piVar3 = iVar1 * fac[uVar7 - 1];
      }
      return;
    }
    uVar4 = 0;
    do {
      if (uVar7 == uVar4) {
        if (0xff < (int)uVar5) {
          puts("Overflow in grid_factor");
        }
        lVar2 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        prime[lVar2] = iVar8;
        break;
      }
      piVar3 = prime + uVar4;
      uVar4 = uVar4 + 1;
    } while (iVar8 % *piVar3 != 0);
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void grid_factor(int p, int *idx, int *idy) {
  int i, j; 
  int ip, ifac, pmax, prime[MAX_FACTOR];
  int fac[MAX_FACTOR];
  int ix, iy, ichk;

  i = 1;
/**
 *   factor p completely
 *   first, find all prime numbers, besides 1, less than or equal to 
 *   the square root of p
 */
  ip = (int)(sqrt((double)p))+1;
  pmax = 0;
  for (i=2; i<=ip; i++) {
    ichk = 1;
    for (j=0; j<pmax; j++) {
      if (i%prime[j] == 0) {
        ichk = 0;
        break;
      }
    }
    if (ichk) {
      pmax = pmax + 1;
      if (pmax > MAX_FACTOR) printf("Overflow in grid_factor\n");
      prime[pmax-1] = i;
    }
  }
/**
 *   find all prime factors of p
 */
  ip = p;
  ifac = 0;
  for (i=0; i<pmax; i++) {
    while(ip%prime[i] == 0) {
      ifac = ifac + 1;
      fac[ifac-1] = prime[i];
      ip = ip/prime[i];
    }
  }
/**
 *  p is prime
 */
  if (ifac==0) {
    ifac++;
    fac[0] = p;
  }
/**
 *    find two factors of p of approximately the
 *    same size
 */
  *idx = 1;
  *idy = 1;
  for (i = ifac-1; i >= 0; i--) {
    ix = *idx;
    iy = *idy;
    if (ix <= iy) {
      *idx = fac[i]*(*idx);
    } else {
      *idy = fac[i]*(*idy);
    }
  }
}